

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolor.cpp
# Opt level: O0

optional<unsigned_int> qt_get_hex_rgb(char *name)

{
  bool bVar1;
  QRgba64 *this;
  optional<unsigned_int> *in_RDI;
  long in_FS_OFFSET;
  optional<QRgba64> rgba64;
  uint *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *name_00;
  _Optional_payload_base<unsigned_int> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  name_00 = &DAT_aaaaaaaaaaaaaaaa;
  qstrlen((char *)in_RDI);
  get_hex_rgb(name_00,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  bVar1 = std::optional::operator_cast_to_bool((optional<QRgba64> *)0x4a74c7);
  if (bVar1) {
    this = std::optional<QRgba64>::operator->((optional<QRgba64> *)0x4a74d7);
    QRgba64::toArgb32(this);
    std::optional<unsigned_int>::optional<unsigned_int,_true>(in_RDI,in_stack_ffffffffffffffb8);
  }
  else {
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (optional<unsigned_int>)local_10;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<QRgb> qt_get_hex_rgb(const char *name)
{
    if (std::optional<QRgba64> rgba64 = get_hex_rgb(name, qstrlen(name)))
        return rgba64->toArgb32();
    return std::nullopt;
}